

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O2

void ff_init_longdouble(flexfloat_t *obj,longdouble value,flexfloat_desc_t desc)

{
  obj->value = (double)value;
  obj->desc = desc;
  flexfloat_sanitize(obj);
  return;
}

Assistant:

INLINE void ff_init_longdouble(flexfloat_t *obj, long double value, flexfloat_desc_t desc) {
    obj->value = (fp_t)value;
    #ifdef FLEXFLOAT_TRACKING
    obj->exact_value = (fp_t)value;;
    obj->tracking_fn = 0;
    obj->tracking_arg = 0;
    #endif
    obj->desc = desc;
    flexfloat_sanitize(obj);
}